

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QString>::insert
          (QMovableArrayOps<QString> *this,qsizetype i,qsizetype n,parameter_type t)

{
  qsizetype *pqVar1;
  QString *pQVar2;
  long in_FS_OFFSET;
  bool bVar3;
  Inserter local_70;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (t->d).d;
  local_48.ptr = (t->d).ptr;
  local_48.size = (t->d).size;
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  bVar3 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size != 0;
  QArrayDataPointer<QString>::detachAndGrow
            ((QArrayDataPointer<QString> *)this,(uint)(i == 0 && bVar3),n,(QString **)0x0,
             (QArrayDataPointer<QString> *)0x0);
  if (i == 0 && bVar3) {
    while (bVar3 = n != 0, n = n + -1, bVar3) {
      pQVar2 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      pQVar2[-1].d.d = local_48.d;
      pQVar2[-1].d.ptr = local_48.ptr;
      pQVar2[-1].d.size = local_48.size;
      if (local_48.d != (Data *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        pQVar2 = (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr;
      }
      (this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.ptr = pQVar2 + -1;
      pqVar1 = &(this->super_QGenericArrayOps<QString>).super_QArrayDataPointer<QString>.size;
      *pqVar1 = *pqVar1 + 1;
    }
  }
  else {
    Inserter::Inserter(&local_70,(QArrayDataPointer<QString> *)this,i,n);
    Inserter::insertFill(&local_70,(QString *)&local_48,n);
    (local_70.data)->size = (local_70.data)->size + local_70.nInserts;
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        if (growsAtBegin) {
            // copy construct items in reverse order at the begin
            Q_ASSERT(this->freeSpaceAtBegin() >= n);
            while (n--) {
                new (this->begin() - 1) T(copy);
                --this->ptr;
                ++this->size;
            }
        } else {
            Inserter(this, i, n).insertFill(copy, n);
        }
    }